

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ResultBuilder * __thiscall
Catch::ExpressionLhs<RegionDetector::Region*const&>::
captureExpression<(Catch::Internal::Operator)0,RegionDetector::Region*>
          (ExpressionLhs<RegionDetector::Region*const&> *this,Region **rhs)

{
  ResultBuilder *pRVar1;
  Region **value;
  Region **value_00;
  string local_88;
  string local_68;
  string local_48;
  allocator local_21;
  
  pRVar1 = ResultBuilder::setResultType
                     (*(ResultBuilder **)this,(Region *)**(long **)(this + 8) == *rhs);
  toString<RegionDetector::Region*>(&local_88,*(Catch **)(this + 8),value);
  pRVar1 = ResultBuilder::setLhs(pRVar1,&local_88);
  toString<RegionDetector::Region*>(&local_68,(Catch *)rhs,value_00);
  pRVar1 = ResultBuilder::setRhs(pRVar1,&local_68);
  std::__cxx11::string::string((string *)&local_48,"==",&local_21);
  pRVar1 = ResultBuilder::setOp(pRVar1,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  return pRVar1;
}

Assistant:

ResultBuilder& captureExpression(RhsT const& rhs) {
			return m_rb
				.setResultType(Internal::compare<Op>(m_lhs, rhs))
				.setLhs(Catch::toString(m_lhs))
				.setRhs(Catch::toString(rhs))
				.setOp(Internal::OperatorTraits<Op>::getName());
		}